

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

void add_s(MatchState *ms,luaL_Buffer *b,char *s,char *e)

{
  char cVar1;
  lua_State *L_00;
  long lVar2;
  char *pcVar3;
  ushort **ppuVar4;
  char *news;
  lua_State *L;
  size_t i;
  size_t l;
  char *e_local;
  char *s_local;
  luaL_Buffer *b_local;
  MatchState *ms_local;
  
  L_00 = ms->L;
  l = (size_t)e;
  e_local = s;
  s_local = (char *)b;
  b_local = (luaL_Buffer *)ms;
  pcVar3 = lua_tolstring(L_00,3,&i);
  for (L = (lua_State *)0x0; L < i; L = (lua_State *)((long)&L->next + 1)) {
    if (pcVar3[(long)L] == '%') {
      L = (lua_State *)((long)&L->next + 1);
      ppuVar4 = __ctype_b_loc();
      if (((*ppuVar4)[(int)(uint)(byte)pcVar3[(long)L]] & 0x800) == 0) {
        if (pcVar3[(long)L] != '%') {
          luaL_error(L_00,"invalid use of \'%c\' in replacement string",0x25);
        }
        if (*(ulong *)(s_local + 8) <= *(ulong *)(s_local + 0x10)) {
          luaL_prepbuffsize((luaL_Buffer *)s_local,1);
        }
        cVar1 = pcVar3[(long)L];
        lVar2 = *(long *)(s_local + 0x10);
        *(long *)(s_local + 0x10) = lVar2 + 1;
        *(char *)(*(long *)s_local + lVar2) = cVar1;
      }
      else if (pcVar3[(long)L] == '0') {
        luaL_addlstring((luaL_Buffer *)s_local,e_local,l - (long)e_local);
      }
      else {
        push_onecapture((MatchState *)b_local,pcVar3[(long)L] + -0x31,e_local,(char *)l);
        luaL_tolstring(L_00,-1,(size_t *)0x0);
        lua_rotate(L_00,-2,-1);
        lua_settop(L_00,-2);
        luaL_addvalue((luaL_Buffer *)s_local);
      }
    }
    else {
      if (*(ulong *)(s_local + 8) <= *(ulong *)(s_local + 0x10)) {
        luaL_prepbuffsize((luaL_Buffer *)s_local,1);
      }
      cVar1 = pcVar3[(long)L];
      lVar2 = *(long *)(s_local + 0x10);
      *(long *)(s_local + 0x10) = lVar2 + 1;
      *(char *)(*(long *)s_local + lVar2) = cVar1;
    }
  }
  return;
}

Assistant:

static void add_s (MatchState *ms, luaL_Buffer *b, const char *s,
                                                   const char *e) {
  size_t l, i;
  lua_State *L = ms->L;
  const char *news = lua_tolstring(L, 3, &l);
  for (i = 0; i < l; i++) {
    if (news[i] != L_ESC)
      luaL_addchar(b, news[i]);
    else {
      i++;  /* skip ESC */
      if (!isdigit(uchar(news[i]))) {
        if (news[i] != L_ESC)
          luaL_error(L, "invalid use of '%c' in replacement string", L_ESC);
        luaL_addchar(b, news[i]);
      }
      else if (news[i] == '0')
          luaL_addlstring(b, s, e - s);
      else {
        push_onecapture(ms, news[i] - '1', s, e);
        luaL_tolstring(L, -1, NULL);  /* if number, convert it to string */
        lua_remove(L, -2);  /* remove original value */
        luaL_addvalue(b);  /* add capture to accumulated result */
      }
    }
  }
}